

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O1

void __thiscall flexbuffers::Builder::Int(Builder *this,int64_t i)

{
  pointer *ppVVar1;
  iterator __position;
  ulong uVar2;
  anon_union_8_3_83789bcb_for_Value_0 local_10;
  undefined4 uStack_8;
  int iStack_4;
  
  uVar2 = i >> 0x3f ^ i * 2;
  iStack_4 = 0;
  if ((0xff < uVar2) && (iStack_4 = 1, 0xffff < uVar2)) {
    iStack_4 = 3 - (uint)(uVar2 >> 0x20 == 0);
  }
  uStack_8 = 1;
  __position._M_current =
       (this->stack_).
       super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stack_).
      super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_10.i_ = i;
    std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
    _M_realloc_insert<flexbuffers::Builder::Value>(&this->stack_,__position,(Value *)&local_10);
  }
  else {
    ((__position._M_current)->field_0).i_ = i;
    (__position._M_current)->type_ = 1;
    (__position._M_current)->min_bit_width_ = iStack_4;
    ppVVar1 = &(this->stack_).
               super__Vector_base<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return;
}

Assistant:

inline BitWidth WidthI(int64_t i) {
  auto u = static_cast<uint64_t>(i) << 1;
  return WidthU(i >= 0 ? u : ~u);
}